

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O2

void keypoint_approach(Mat *image_model,Mat *image_test)

{
  bool bVar1;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test;
  _InputArray *keypoint_model;
  Scalar_<double> local_378;
  _InputArray local_350;
  _InputArray local_338;
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  knn_matches;
  Ptr<cv::DescriptorMatcher> matcher;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_2e8;
  _InputOutputArray local_270;
  _InputArray local_258;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> filtered_matches;
  _Vector_base<char,_std::allocator<char>_> local_218;
  Mat img_keypoint_model;
  Mat img_keypoint_test;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_140;
  ORB_Param local_c8;
  ORB_Param local_a8;
  Mat img_keypoint_matches;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"pretreat model",(allocator<char> *)&local_140);
  cv::namedWindow((string *)&local_2e8,0);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"pretreat model",(allocator<char> *)&img_keypoint_model);
  local_140.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_140.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_model;
  cv::imshow((string *)&local_2e8,(_InputArray *)&local_140);
  std::__cxx11::string::~string((string *)&local_2e8);
  cv::waitKey(0);
  cv::destroyAllWindows();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"pretreat test",(allocator<char> *)&local_140);
  cv::namedWindow((string *)&local_2e8,0);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"pretreat test",(allocator<char> *)&img_keypoint_model);
  local_140.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1010000;
  local_140.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)image_test;
  cv::imshow((string *)&local_2e8,(_InputArray *)&local_140);
  std::__cxx11::string::~string((string *)&local_2e8);
  cv::waitKey(0);
  cv::destroyAllWindows();
  local_a8.patchSize = 0x1f;
  local_a8.WTA_K = 2;
  local_c8.patchSize = 0x1f;
  local_c8.WTA_K = 4;
  local_a8.nfeature = 10000;
  local_a8.nlevels = 8;
  local_a8.edgeThreshold = 0x1f;
  local_a8.fastThreshold = 0x14;
  local_c8.nfeature = 10000;
  local_c8.nlevels = 8;
  local_c8.edgeThreshold = 100;
  local_c8.fastThreshold = 0x14;
  keypoint_compute(&local_2e8,image_model,&local_a8);
  keypoint_compute(&local_140,image_test,&local_c8);
  _img_keypoint_model = 4;
  cv::DescriptorMatcher::create((MatcherType *)&matcher);
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  knn_matches.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _img_keypoint_model = 0x1010000;
  _img_keypoint_test = 0x1010000;
  bVar1 = (bool)cv::noArray();
  keypoint_model = (_InputArray *)&img_keypoint_model;
  cv::DescriptorMatcher::knnMatch
            (_matcher,(_InputArray *)&img_keypoint_model,(vector *)&img_keypoint_test,
             (int)&knn_matches,(_InputArray *)0x2,bVar1);
  filter_match(&filtered_matches,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)keypoint_model,keypoint_test,
               &knn_matches,0.75);
  cv::Mat::Mat(&img_keypoint_model);
  cv::Mat::Mat(&img_keypoint_test);
  cv::Mat::Mat(&img_keypoint_matches);
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_350.sz.width = 0;
  local_350.sz.height = 0;
  local_338.flags = 0x1010000;
  local_350.flags = 0x3010000;
  local_350.obj = (_InputArray *)&img_keypoint_model;
  local_338.obj = image_model;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_378);
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  cv::drawKeypoints(&local_338,(vector *)&local_2e8,(_InputOutputArray *)&local_350,
                    (Scalar_ *)&local_378,DEFAULT);
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_350.sz.width = 0;
  local_350.sz.height = 0;
  local_338.flags = 0x1010000;
  local_350.flags = 0x3010000;
  local_350.obj = &img_keypoint_test;
  local_338.obj = image_test;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_378);
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 0.0;
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_378.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  cv::drawKeypoints(&local_338,(vector *)&local_140,(_InputOutputArray *)&local_350,
                    (Scalar_ *)&local_378,DEFAULT);
  local_350.sz.width = 0;
  local_350.sz.height = 0;
  local_350.flags = 0x1010000;
  local_258.sz.width = 0;
  local_258.sz.height = 0;
  local_270.super__OutputArray.super__InputArray.sz.width = 0;
  local_270.super__OutputArray.super__InputArray.sz.height = 0;
  local_258.flags = 0x1010000;
  local_270.super__OutputArray.super__InputArray.flags = 0x3010000;
  local_350.obj = image_model;
  local_270.super__OutputArray.super__InputArray.obj = &img_keypoint_matches;
  local_258.obj = image_test;
  cv::Scalar_<double>::all(&local_378,-1.0);
  cv::Scalar_<double>::all((Scalar_<double> *)&local_338,-1.0);
  local_218._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cv::drawMatches(&local_350,(vector *)&local_2e8,&local_258,(vector *)&local_140,
                  (vector *)&filtered_matches,&local_270,(Scalar_ *)&local_378,(Scalar_ *)&local_338
                  ,(vector *)&local_218,DEFAULT);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Keypoint model",(allocator<char> *)&local_338);
  cv::namedWindow((string *)&local_378,0);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Keypoint model",(allocator<char> *)&local_350);
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_338.obj = &img_keypoint_model;
  cv::imshow((string *)&local_378,&local_338);
  std::__cxx11::string::~string((string *)&local_378);
  cv::waitKey(0);
  cv::destroyAllWindows();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Keypoint test",(allocator<char> *)&local_338);
  cv::namedWindow((string *)&local_378,0);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Keypoint test",(allocator<char> *)&local_350);
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_338.obj = &img_keypoint_test;
  cv::imshow((string *)&local_378,&local_338);
  std::__cxx11::string::~string((string *)&local_378);
  cv::waitKey(0);
  cv::destroyAllWindows();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Keypoint matches",(allocator<char> *)&local_338);
  cv::namedWindow((string *)&local_378,0);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Keypoint matches",(allocator<char> *)&local_350);
  local_338.sz.width = 0;
  local_338.sz.height = 0;
  local_338.flags = 0x1010000;
  local_338.obj = &img_keypoint_matches;
  cv::imshow((string *)&local_378,&local_338);
  std::__cxx11::string::~string((string *)&local_378);
  cv::waitKey(0);
  cv::destroyAllWindows();
  cv::Mat::~Mat(&img_keypoint_matches);
  cv::Mat::~Mat(&img_keypoint_test);
  cv::Mat::~Mat(&img_keypoint_model);
  std::_Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>::~_Vector_base
            (&filtered_matches.super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>);
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::~vector(&knn_matches);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f0);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair(&local_140);
  std::pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat>::~pair(&local_2e8);
  return;
}

Assistant:

void keypoint_approach(const cv::Mat& image_model, const cv::Mat& image_test)
{
    cv::namedWindow("pretreat model", cv::WINDOW_NORMAL);
    cv::imshow("pretreat model", image_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("pretreat test", cv::WINDOW_NORMAL);
    cv::imshow("pretreat test", image_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    ORB_Param param_model, test_param;
    param_model.nfeature = 10000;

    test_param.nfeature = 10000;
    // test_param.nlevels = 16;
    test_param.WTA_K = 4;
    test_param.edgeThreshold = 100;

    auto [keypoint_model, descriptor_model] = keypoint_compute(image_model, param_model);
    auto [keypoint_test, descriptor_test] = keypoint_compute(image_test, test_param);

#if CV_MAJOR_VERSION < 3
    auto matcher = cv::DescriptorMatcher::create("NORM_HAMMING");
#else
    auto matcher = cv::DescriptorMatcher::create(cv::DescriptorMatcher::BRUTEFORCE_HAMMING);
#endif

    std::vector<std::vector<cv::DMatch>> knn_matches;
    matcher->knnMatch(descriptor_model, descriptor_test, knn_matches, 2);

    const float ratio_thresh = 0.75f;
    std::vector<cv::DMatch> filtered_matches = filter_match(keypoint_model, keypoint_test, knn_matches, ratio_thresh);

    cv::Mat img_keypoint_model, img_keypoint_test, img_keypoint_matches;

    cv::drawKeypoints(image_model, keypoint_model, img_keypoint_model, cv::Scalar(0, 255, 0));
    cv::drawKeypoints(image_test, keypoint_test, img_keypoint_test, cv::Scalar(0, 255, 0));
    cv::drawMatches(image_model, keypoint_model, image_test, keypoint_test, filtered_matches, img_keypoint_matches);

    cv::namedWindow("Keypoint model", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint model", img_keypoint_model);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint test", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint test", img_keypoint_test);
    cv::waitKey(0);
    cv::destroyAllWindows();

    cv::namedWindow("Keypoint matches", cv::WINDOW_NORMAL);
    cv::imshow("Keypoint matches", img_keypoint_matches);
    cv::waitKey(0);
    cv::destroyAllWindows();
}